

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::finishEdit(QTextDocumentPrivate *this)

{
  bool bVar1;
  int iVar2;
  QTextDocument *pQVar3;
  QTextCursorPrivate **ppQVar4;
  const_iterator this_00;
  const_iterator o;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextCursor *cursor;
  add_const_t<QList<QTextCursor>_> *__range1_1;
  QTextCursorPrivate *curs;
  add_const_t<QSet<QTextCursorPrivate_*>_> *__range1;
  QTextDocument *q;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QTextCursor> changedCursors;
  QScopedValueRollback<bool> bg;
  QScopedValueRollback<bool> *in_stack_ffffffffffffff60;
  QTextDocumentPrivate *in_stack_ffffffffffffff68;
  QTextDocumentPrivate *in_stack_ffffffffffffff70;
  QSet<QTextCursorPrivate_*> *this_01;
  QTextDocumentPrivate *pQVar5;
  QTextDocumentPrivate *in_stack_ffffffffffffff90;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  pQVar3 = q_func(in_RDI);
  if (in_RDI->editBlock == 0) {
    if ((in_RDI->framesDirty & 1U) != 0) {
      scan_frames(in_stack_ffffffffffffff90,(int)((ulong)pQVar5 >> 0x20),(int)pQVar5,
                  (int)((ulong)pQVar3 >> 0x20));
    }
    if ((in_RDI->lout != (QAbstractTextDocumentLayout *)0x0) && (-1 < in_RDI->docChangeFrom)) {
      if ((in_RDI->inContentsChange & 1U) == 0) {
        local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QScopedValueRollback<bool>::QScopedValueRollback
                  (in_stack_ffffffffffffff60,(bool *)in_RDI,
                   SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
        QTextDocument::contentsChange
                  ((QTextDocument *)in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (int)in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        QScopedValueRollback<bool>::~QScopedValueRollback((QScopedValueRollback<bool> *)local_18);
      }
      (**(code **)(*(long *)in_RDI->lout + 0x90))
                (in_RDI->lout,in_RDI->docChangeFrom,in_RDI->docChangeOldLength,
                 in_RDI->docChangeLength);
    }
    in_RDI->docChangeFrom = -1;
    if ((in_RDI->field_0x294 & 1) != 0) {
      in_RDI->field_0x294 = in_RDI->field_0x294 & 0xfe;
      bVar1 = ensureMaximumBlockCount(in_stack_ffffffffffffff68);
      if (bVar1) goto LAB_007d2fae;
    }
    QList<QTextCursor>::QList((QList<QTextCursor> *)0x7d2d97);
    this_01 = &in_RDI->cursors;
    QSet<QTextCursorPrivate_*>::begin(this_01);
    QSet<QTextCursorPrivate_*>::end(this_01);
    while (bVar1 = QSet<QTextCursorPrivate_*>::const_iterator::operator!=
                             ((const_iterator *)in_stack_ffffffffffffff60,(const_iterator *)in_RDI),
          bVar1) {
      ppQVar4 = QSet<QTextCursorPrivate_*>::const_iterator::operator*((const_iterator *)0x7d2e22);
      in_stack_ffffffffffffff70 = (QTextDocumentPrivate *)*ppQVar4;
      if (((byte)in_stack_ffffffffffffff70->field_0x28 >> 2 & 1) != 0) {
        in_stack_ffffffffffffff70->field_0x28 = in_stack_ffffffffffffff70->field_0x28 & 0xfb;
        QTextCursor::QTextCursor
                  ((QTextCursor *)in_stack_ffffffffffffff60,(QTextCursorPrivate *)in_RDI);
        QList<QTextCursor>::append
                  ((QList<QTextCursor> *)in_stack_ffffffffffffff60,(rvalue_ref)in_RDI);
        QTextCursor::~QTextCursor((QTextCursor *)0x7d2e78);
      }
      QSet<QTextCursorPrivate_*>::const_iterator::operator++
                ((const_iterator *)in_stack_ffffffffffffff60);
    }
    this_00 = QList<QTextCursor>::begin((QList<QTextCursor> *)in_stack_ffffffffffffff60);
    o = QList<QTextCursor>::end((QList<QTextCursor> *)in_stack_ffffffffffffff60);
    while (bVar1 = QList<QTextCursor>::const_iterator::operator!=
                             ((const_iterator *)&stack0xffffffffffffffa0,o), bVar1) {
      pQVar3 = (QTextDocument *)
               QList<QTextCursor>::const_iterator::operator*
                         ((const_iterator *)&stack0xffffffffffffffa0);
      QTextDocument::cursorPositionChanged(pQVar3,(QTextCursor *)in_RDI);
      QList<QTextCursor>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffa0);
    }
    contentsChanged(in_stack_ffffffffffffff70);
    iVar2 = QFragmentMap<QTextBlockData>::numNodes(&in_RDI->blocks);
    if (iVar2 != in_RDI->lastBlockCount) {
      iVar2 = QFragmentMap<QTextBlockData>::numNodes(&in_RDI->blocks);
      in_RDI->lastBlockCount = iVar2;
      QTextDocument::blockCountChanged((QTextDocument *)0x7d2f81,(int)((ulong)in_RDI >> 0x20));
    }
    if (((in_RDI->undoEnabled & 1U) == 0) && (in_RDI->unreachableCharacterCount != 0)) {
      compressPieceTable((QTextDocumentPrivate *)this_00.i);
    }
    QList<QTextCursor>::~QList((QList<QTextCursor> *)0x7d2fae);
  }
LAB_007d2fae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::finishEdit()
{
    Q_Q(QTextDocument);

    if (editBlock)
        return;

    if (framesDirty)
        scan_frames(docChangeFrom, docChangeOldLength, docChangeLength);

    if (lout && docChangeFrom >= 0) {
        if (!inContentsChange) {
            QScopedValueRollback<bool> bg(inContentsChange, true);
            emit q->contentsChange(docChangeFrom, docChangeOldLength, docChangeLength);
        }
        lout->documentChanged(docChangeFrom, docChangeOldLength, docChangeLength);
    }

    docChangeFrom = -1;

    if (needsEnsureMaximumBlockCount) {
        needsEnsureMaximumBlockCount = false;
        if (ensureMaximumBlockCount()) {
            // if ensureMaximumBlockCount() returns true
            // it will have called endEditBlock() and
            // compressPieceTable() itself, so we return here
            // to prevent getting two contentsChanged emits
            return;
        }
    }

    QList<QTextCursor> changedCursors;
    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        if (curs->changed) {
            curs->changed = false;
            changedCursors.append(QTextCursor(curs));
        }
    }
    for (const QTextCursor &cursor : std::as_const(changedCursors))
        emit q->cursorPositionChanged(cursor);

    contentsChanged();

    if (blocks.numNodes() != lastBlockCount) {
        lastBlockCount = blocks.numNodes();
        emit q->blockCountChanged(lastBlockCount);
    }

    if (!undoEnabled && unreachableCharacterCount)
        compressPieceTable();
}